

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

void __thiscall
QtMWidgets::AbstractScrollArea::AbstractScrollArea(AbstractScrollArea *this,QWidget *parent)

{
  AbstractScrollAreaPrivate *pAVar1;
  AbstractScrollAreaPrivate *this_00;
  ConnectionType type;
  Object local_178 [8];
  code *local_170;
  undefined8 uStack_168;
  code *local_160;
  undefined8 local_158;
  Object local_150 [8];
  code *local_148;
  undefined8 uStack_140;
  code *local_138;
  undefined8 local_130;
  Object local_128 [8];
  code *local_120;
  undefined8 uStack_118;
  code *local_110;
  undefined8 local_108;
  Object local_100 [8];
  code *local_f8;
  undefined8 uStack_f0;
  code *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [16];
  QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
  QStack_c8;
  code *local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [16];
  QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
  QStack_a0;
  code *local_98;
  undefined8 local_90;
  undefined1 local_88 [16];
  QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
  QStack_78;
  code *local_70;
  undefined8 local_68;
  Object local_60 [8];
  code *local_58;
  undefined8 uStack_50;
  code *local_48;
  undefined8 local_40;
  Object local_38 [28];
  QFlags<Qt::WindowType> local_1c;
  QWidget *local_18;
  QWidget *parent_local;
  AbstractScrollArea *this_local;
  
  local_18 = parent;
  parent_local = (QWidget *)this;
  QFlags<Qt::WindowType>::QFlags(&local_1c);
  QFrame::QFrame(&this->super_QFrame,parent,(QFlags_conflict1 *)(ulong)local_1c.i);
  *(undefined ***)this = &PTR_metaObject_00232f18;
  *(undefined ***)&this->field_0x10 = &PTR__AbstractScrollArea_002330e0;
  pAVar1 = (AbstractScrollAreaPrivate *)operator_new(0xa8);
  AbstractScrollAreaPrivate::AbstractScrollAreaPrivate(pAVar1,this);
  QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
  ::QScopedPointer(&this->d,pAVar1);
  this_00 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
            ::operator->(&this->d);
  AbstractScrollAreaPrivate::init(this_00,(EVP_PKEY_CTX *)pAVar1);
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  local_48 = QTimer::timeout;
  local_40 = 0;
  local_58 = _q_animateScrollIndicators;
  uStack_50 = 0;
  type = (ConnectionType)this;
  QObject::
  connect<void(QTimer::*)(QTimer::QPrivateSignal),void(QtMWidgets::AbstractScrollArea::*)()>
            (local_38,(offset_in_QTimer_to_subr)pAVar1->animationTimer,(Object *)QTimer::timeout,0,
             type);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  local_70 = QTimer::timeout;
  local_68 = 0;
  local_88._8_8_ = _q_startBlurAnim;
  QStack_78.d = (ScrollerPrivate *)0x0;
  QObject::
  connect<void(QTimer::*)(QTimer::QPrivateSignal),void(QtMWidgets::AbstractScrollArea::*)()>
            (local_60,(offset_in_QTimer_to_subr)pAVar1->startBlurAnimTimer,(Object *)QTimer::timeout
             ,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  local_98 = Scroller::scroll;
  local_90 = 0;
  local_b0._8_8_ = _q_kineticScrolling;
  QStack_a0.d = (ScrollerPrivate *)0x0;
  QObject::
  connect<void(QtMWidgets::Scroller::*)(int,int),void(QtMWidgets::AbstractScrollArea::*)(int,int)>
            ((Object *)local_88,(offset_in_Scroller_to_subr)pAVar1->scroller,
             (Object *)Scroller::scroll,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_88);
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  local_c0 = Scroller::aboutToStart;
  local_b8 = 0;
  local_d8._8_8_ = _q_kineticScrollingAboutToStart;
  QStack_c8.d = (ScrollerPrivate *)0x0;
  QObject::connect<void(QtMWidgets::Scroller::*)(),void(QtMWidgets::AbstractScrollArea::*)()>
            ((Object *)local_b0,(offset_in_Scroller_to_subr)pAVar1->scroller,
             (Object *)Scroller::aboutToStart,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_b0);
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  local_e8 = Scroller::finished;
  local_e0 = 0;
  local_f8 = _q_kineticScrollingFinished;
  uStack_f0 = 0;
  QObject::connect<void(QtMWidgets::Scroller::*)(),void(QtMWidgets::AbstractScrollArea::*)()>
            ((Object *)local_d8,(offset_in_Scroller_to_subr)pAVar1->scroller,
             (Object *)Scroller::finished,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_d8);
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  local_110 = QVariantAnimation::valueChanged;
  local_108 = 0;
  local_120 = _q_horBlurAnim;
  uStack_118 = 0;
  QObject::
  connect<void(QVariantAnimation::*)(QVariant_const&),void(QtMWidgets::AbstractScrollArea::*)(QVariant_const&)>
            (local_100,(offset_in_QVariantAnimation_to_subr)pAVar1->horBlurAnim,
             (Object *)QVariantAnimation::valueChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_100);
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  local_138 = QAbstractAnimation::finished;
  local_130 = 0;
  local_148 = _q_horBlurAnimFinished;
  uStack_140 = 0;
  QObject::connect<void(QAbstractAnimation::*)(),void(QtMWidgets::AbstractScrollArea::*)()>
            (local_128,(offset_in_QAbstractAnimation_to_subr)pAVar1->horBlurAnim,
             (Object *)QAbstractAnimation::finished,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_128);
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  local_160 = QVariantAnimation::valueChanged;
  local_158 = 0;
  local_170 = _q_vertBlurAnim;
  uStack_168 = 0;
  QObject::
  connect<void(QVariantAnimation::*)(QVariant_const&),void(QtMWidgets::AbstractScrollArea::*)(QVariant_const&)>
            (local_150,(offset_in_QVariantAnimation_to_subr)pAVar1->vertBlurAnim,
             (Object *)QVariantAnimation::valueChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_150);
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  QObject::connect<void(QAbstractAnimation::*)(),void(QtMWidgets::AbstractScrollArea::*)()>
            (local_178,(offset_in_QAbstractAnimation_to_subr)pAVar1->vertBlurAnim,
             (Object *)QAbstractAnimation::finished,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_178);
  return;
}

Assistant:

AbstractScrollArea::AbstractScrollArea( QWidget * parent )
	:	QFrame( parent )
	,	d( new AbstractScrollAreaPrivate( this ) )
{
	d->init();

	connect( d->animationTimer, &QTimer::timeout,
		this, &AbstractScrollArea::_q_animateScrollIndicators );

	connect( d->startBlurAnimTimer, &QTimer::timeout,
		this, &AbstractScrollArea::_q_startBlurAnim );

	connect( d->scroller, &Scroller::scroll,
		this, &AbstractScrollArea::_q_kineticScrolling );

	connect( d->scroller, &Scroller::aboutToStart,
		this, &AbstractScrollArea::_q_kineticScrollingAboutToStart );

	connect( d->scroller, &Scroller::finished,
		this, &AbstractScrollArea::_q_kineticScrollingFinished );

	connect( d->horBlurAnim, &QVariantAnimation::valueChanged,
		this, &AbstractScrollArea::_q_horBlurAnim );

	connect( d->horBlurAnim, &QVariantAnimation::finished,
		this, &AbstractScrollArea::_q_horBlurAnimFinished );

	connect( d->vertBlurAnim, &QVariantAnimation::valueChanged,
		this, &AbstractScrollArea::_q_vertBlurAnim );

	connect( d->vertBlurAnim, &QVariantAnimation::finished,
		this, &AbstractScrollArea::_q_vertBlurAnimFinished );
}